

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_rect nk_widget_bounds(nk_context *ctx)

{
  nk_context *in_RDI;
  nk_rect bounds;
  undefined8 local_28;
  undefined8 local_20;
  nk_rect *in_stack_fffffffffffffff0;
  nk_rect local_10;
  undefined8 uStack_8;
  
  if ((in_RDI == (nk_context *)0x0) || (in_RDI->current == (nk_window *)0x0)) {
    local_10 = nk_rect(0.0,0.0,0.0,0.0);
  }
  else {
    nk_layout_peek(in_stack_fffffffffffffff0,in_RDI);
    uStack_8 = local_20;
    in_stack_fffffffffffffff0 = (nk_rect *)local_28;
  }
  return local_10;
}

Assistant:

NK_API struct nk_rect
nk_widget_bounds(struct nk_context *ctx)
{
struct nk_rect bounds;
NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
if (!ctx || !ctx->current)
return nk_rect(0,0,0,0);
nk_layout_peek(&bounds, ctx);
return bounds;
}